

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall icu_63::Edits::Iterator::previous(Iterator *this,UErrorCode *errorCode)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  uint16_t *puVar4;
  ulong uVar5;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  if (-1 < this->dir) {
    if (this->dir != '\0') {
      if (0 < this->remaining) {
        this->index = this->index + -1;
        this->dir = -1;
        return '\x01';
      }
      updateNextIndexes(this);
    }
    this->dir = -1;
  }
  uVar9 = this->remaining;
  if ((int)uVar9 < 1) {
    uVar5 = (ulong)(uint)this->index;
  }
  else {
    uVar5 = (ulong)this->index;
    if (uVar9 <= (this->array[uVar5] & 0x1ff)) {
      this->remaining = uVar9 + 1;
      goto LAB_002cca48;
    }
    this->remaining = 0;
  }
  if ((int)uVar5 < 1) {
    *(undefined2 *)((long)&this->newLength_ + 2) = 0;
    *(undefined8 *)&this->dir = 0;
    return '\0';
  }
  puVar4 = this->array;
  uVar8 = (int)uVar5 - 1;
  uVar10 = (ulong)uVar8;
  this->index = uVar8;
  uVar1 = puVar4[uVar10];
  uVar9 = (uint)uVar1;
  if (uVar1 < 0x1000) {
    this->changed = '\0';
    while( true ) {
      iVar6 = uVar9 + 1;
      if (((int)uVar10 < 1) || (uVar1 = puVar4[uVar10 - 1], 0xfff < uVar1)) break;
      uVar9 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar9;
      this->index = uVar9;
      uVar9 = iVar6 + (uint)uVar1;
    }
    this->oldLength_ = iVar6;
    this->newLength_ = iVar6;
  }
  else {
    this->changed = '\x01';
    if (uVar1 < 0x7000) {
      uVar8 = uVar1 >> 9 & 7;
      if (this->coarse != '\0') {
        iVar6 = (uVar9 & 0x1ff) + 1;
        this->oldLength_ = (uint)(uVar1 >> 0xc) * iVar6;
        iVar7 = iVar6 * uVar8;
        this->newLength_ = iVar7;
LAB_002ccaf8:
        do {
          do {
            iVar6 = (int)uVar10;
            if (iVar6 < 1) goto LAB_002cca48;
            uVar1 = this->array[uVar10 - 1];
            if (uVar1 < 0x1000) goto LAB_002cca48;
            uVar9 = iVar6 - 1;
            uVar10 = (ulong)uVar9;
            this->index = uVar9;
            if (uVar1 < 0x7000) {
              iVar3 = (uVar1 & 0x1ff) + 1;
              this->oldLength_ = this->oldLength_ + (uint)(uVar1 >> 0xc) * iVar3;
              iVar7 = iVar7 + (uVar1 >> 9 & 7) * iVar3;
              this->newLength_ = iVar7;
              goto LAB_002ccb8c;
            }
          } while ((short)uVar1 < 0);
          this->index = iVar6;
          iVar7 = readLength(this,uVar1 >> 6 & 0x3f);
          this->oldLength_ = this->oldLength_ + iVar7;
          iVar7 = readLength(this,uVar1 & 0x3f);
          iVar7 = iVar7 + this->newLength_;
          this->newLength_ = iVar7;
          this->index = uVar9;
LAB_002ccb8c:
          uVar10 = (ulong)(iVar6 - 1);
        } while( true );
      }
      this->oldLength_ = (uint)(uVar1 >> 0xc);
      this->newLength_ = uVar8;
      if ((uVar1 & 0x1ff) != 0) {
        this->remaining = 1;
      }
    }
    else {
      if ((short)uVar1 < 0) {
        puVar4 = puVar4 + uVar8;
        do {
          puVar4 = puVar4 + -1;
          uVar2 = *puVar4;
          iVar6 = (int)uVar5;
          uVar9 = iVar6 - 1;
          uVar5 = (ulong)uVar9;
        } while ((short)uVar2 < 0);
        this->index = uVar9;
        iVar7 = readLength(this,(uint)(int)(short)uVar2 >> 6 & 0x3f);
        this->oldLength_ = iVar7;
        iVar7 = readLength(this,(int)(short)uVar2 & 0x3f);
        this->newLength_ = iVar7;
        this->index = iVar6 + -2;
      }
      else {
        iVar7 = readLength(this,uVar1 >> 6 & 0x3f);
        this->oldLength_ = iVar7;
        iVar7 = readLength(this,uVar9 & 0x3f);
        this->newLength_ = iVar7;
      }
      if (this->coarse != '\0') {
        uVar10 = (ulong)(uint)this->index;
        goto LAB_002ccaf8;
      }
    }
  }
LAB_002cca48:
  updatePreviousIndexes(this);
  return '\x01';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }